

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

uchar __thiscall
PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::in<unsigned_char>
          (IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this,uint16_t port)

{
  bool bVar1;
  byte bVar2;
  DMA *pDVar3;
  FloppyController *pFVar4;
  pointer puVar5;
  uint8_t uVar6;
  byte *pbVar7;
  ssize_t sVar8;
  void *in_RDX;
  byte bVar9;
  int __fd;
  undefined6 in_register_00000032;
  pointer puVar10;
  
  __fd = (int)CONCAT62(in_register_00000032,port);
  bVar9 = 0xff;
  if (0x277 < __fd) {
    if (__fd < 0x3b8) {
      if ((__fd - 0x2e8U < 0x18) && ((0xff00ffU >> (__fd - 0x2e8U & 0x1f) & 1) != 0)) {
        return 0xff;
      }
      if (__fd - 0x278U < 3) {
        return 0xff;
      }
      if (__fd - 0x378U < 3) {
        return 0xff;
      }
    }
    else {
      switch(__fd) {
      case 0x3da:
        return (this->video_->crtc_).bus_state_.display_enable ^ 5U |
               ((this->video_->crtc_).bus_state_.vsync != false) * '\t';
      case 0x3db:
      case 0x3dc:
      case 0x3dd:
      case 0x3de:
      case 0x3df:
      case 0x3e0:
      case 0x3e1:
      case 0x3e2:
      case 0x3e3:
      case 0x3e4:
      case 0x3e5:
      case 0x3e6:
      case 999:
      case 0x3f0:
      case 0x3f1:
      case 0x3f2:
      case 0x3f3:
      case 0x3f6:
      case 0x3f7:
        break;
      case 1000:
      case 0x3e9:
      case 0x3ea:
      case 0x3eb:
      case 0x3ec:
      case 0x3ed:
      case 0x3ee:
      case 0x3ef:
      case 0x3f8:
      case 0x3f9:
      case 0x3fa:
      case 0x3fb:
      case 0x3fc:
      case 0x3fd:
      case 0x3fe:
      case 0x3ff:
        return 0xff;
      case 0x3f4:
        return (this->fdc_->status_).main_status_;
      case 0x3f5:
        pFVar4 = this->fdc_;
        bVar9 = (pFVar4->status_).main_status_;
        if ((bVar9 & 0x40) == 0) {
          return 0x80;
        }
        puVar5 = (pFVar4->results_).result_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar10 = (pFVar4->results_).result_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        bVar2 = puVar10[-1];
        puVar10 = puVar10 + -1;
        (pFVar4->results_).result_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar10;
        if (puVar5 != puVar10) {
          return bVar2;
        }
        (pFVar4->status_).main_status_ = bVar9 & 0xaf;
        return bVar2;
      default:
        if ((__fd - 0x3b8U < 7) && ((0x71U >> (__fd - 0x3b8U & 0x1f) & 1) != 0)) {
          return 0xff;
        }
      }
    }
switchD_00397e8a_caseD_43:
    printf("Unhandled in: %04x\n");
    return 0xff;
  }
  if (0x3f < __fd) {
    if (__fd - 0x40U < 0x32) {
      switch(__fd) {
      case 0x40:
        uVar6 = i8253<false,_PCCompatible::PITObserver>::read<0>(this->pit_);
        return uVar6;
      case 0x41:
        uVar6 = i8253<false,_PCCompatible::PITObserver>::read<1>(this->pit_);
        return uVar6;
      case 0x42:
        uVar6 = i8253<false,_PCCompatible::PITObserver>::read<2>(this->pit_);
        return uVar6;
      case 0x60:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
        sVar8 = Intel::i8255::i8255<PCCompatible::i8255PortHandler>::read
                          (this->ppi_,__fd,in_RDX,
                           (long)&switchD_00397e8a::switchdataD_004d4624 +
                           (long)(int)(&switchD_00397e8a::switchdataD_004d4624)[__fd - 0x40U]);
        return (uchar)sVar8;
      case 0x71:
        sVar8 = RTC::read(this->rtc_,__fd,in_RDX,
                          (long)&switchD_00397e8a::switchdataD_004d4624 +
                          (long)(int)(&switchD_00397e8a::switchdataD_004d4624)[__fd - 0x40U]);
        return (uchar)sVar8;
      }
    }
    else {
      switch(__fd) {
      case 0x80:
        return (this->dma_->pages).pages_[4];
      case 0x81:
        return (this->dma_->pages).pages_[2];
      case 0x82:
        return (this->dma_->pages).pages_[3];
      case 0x83:
        return (this->dma_->pages).pages_[1];
      case 0x84:
        return (this->dma_->pages).pages_[5];
      case 0x85:
        return (this->dma_->pages).pages_[6];
      case 0x86:
        return (this->dma_->pages).pages_[7];
      case 0x87:
        return (this->dma_->pages).pages_[0];
      }
      if (__fd == 0x201) {
        return 0xff;
      }
    }
    goto switchD_00397e8a_caseD_43;
  }
  switch(CONCAT62(in_register_00000032,port) & 0xffffffff) {
  case 0:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[0].address +
                     (ulong)(bVar1 == false));
    break;
  case 1:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[0].count +
                     (ulong)(bVar1 == false));
    break;
  case 2:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[1].address +
                     (ulong)(bVar1 == false));
    break;
  case 3:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[1].count +
                     (ulong)(bVar1 == false));
    break;
  case 4:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[2].address +
                     (ulong)(bVar1 == false));
    break;
  case 5:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[2].count +
                     (ulong)(bVar1 == false));
    break;
  case 6:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[3].address +
                     (ulong)(bVar1 == false));
    break;
  case 7:
    pDVar3 = this->dma_;
    bVar1 = (pDVar3->controller).next_access_low_;
    (pDVar3->controller).next_access_low_ = (bool)(bVar1 ^ 1);
    pbVar7 = (byte *)((long)&(pDVar3->controller).channels_._M_elems[3].count +
                     (ulong)(bVar1 == false));
    break;
  case 8:
    uVar6 = i8237::status(&this->dma_->controller);
    return uVar6;
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xf:
    goto switchD_00397f2c_caseD_9;
  default:
    goto switchD_00397e8a_caseD_43;
  case 0x20:
    return 0;
  case 0x21:
    return this->pic_->mask_;
  }
  bVar9 = *pbVar7;
switchD_00397f2c_caseD_9:
  return bVar9;
}

Assistant:

IntT in([[maybe_unused]] uint16_t port) {
			switch(port) {
				default:
					printf("Unhandled in: %04x\n", port);
				break;

				case 0x0000:	return dma_.controller.read<0x0>();
				case 0x0001:	return dma_.controller.read<0x1>();
				case 0x0002:	return dma_.controller.read<0x2>();
				case 0x0003:	return dma_.controller.read<0x3>();
				case 0x0004:	return dma_.controller.read<0x4>();
				case 0x0005:	return dma_.controller.read<0x5>();
				case 0x0006:	return dma_.controller.read<0x6>();
				case 0x0007:	return dma_.controller.read<0x7>();
				case 0x0008:	return dma_.controller.read<0x8>();
				case 0x000d:	return dma_.controller.read<0xd>();

				case 0x0009:	case 0x000b:
				case 0x000c:	case 0x000f:
					// DMA area, but it doesn't respond.
				break;

				case 0x0020:	return pic_.read<0>();
				case 0x0021:	return pic_.read<1>();

				case 0x0040:	return pit_.read<0>();
				case 0x0041:	return pit_.read<1>();
				case 0x0042:	return pit_.read<2>();

				case 0x0060:	case 0x0061:	case 0x0062:	case 0x0063:
				case 0x0064:	case 0x0065:	case 0x0066:	case 0x0067:
				case 0x0068:	case 0x0069:	case 0x006a:	case 0x006b:
				case 0x006c:	case 0x006d:	case 0x006e:	case 0x006f:
				return ppi_.read(port);

				case 0x0071:	return rtc_.read();

				case 0x0080:	return dma_.pages.page<0>();
				case 0x0081:	return dma_.pages.page<1>();
				case 0x0082:	return dma_.pages.page<2>();
				case 0x0083:	return dma_.pages.page<3>();
				case 0x0084:	return dma_.pages.page<4>();
				case 0x0085:	return dma_.pages.page<5>();
				case 0x0086:	return dma_.pages.page<6>();
				case 0x0087:	return dma_.pages.page<7>();

				case 0x0201:	break;		// Ignore game port.

				case 0x0278:	case 0x0279:	case 0x027a:
				case 0x0378:	case 0x0379:	case 0x037a:
				case 0x03bc:	case 0x03bd:	case 0x03be:
					// Ignore parallel port accesses.
				break;

				case 0x03f4:	return fdc_.status();
				case 0x03f5:	return fdc_.read();

				case 0x03b8:
					if constexpr (video == Target::VideoAdaptor::MDA) {
						return video_.template read<0x8>();
					}
				break;

				case 0x3da:
					if constexpr (video == Target::VideoAdaptor::CGA) {
						return video_.template read<0xa>();
					}
				break;

				case 0x02e8:	case 0x02e9:	case 0x02ea:	case 0x02eb:
				case 0x02ec:	case 0x02ed:	case 0x02ee:	case 0x02ef:
				case 0x02f8:	case 0x02f9:	case 0x02fa:	case 0x02fb:
				case 0x02fc:	case 0x02fd:	case 0x02fe:	case 0x02ff:
				case 0x03e8:	case 0x03e9:	case 0x03ea:	case 0x03eb:
				case 0x03ec:	case 0x03ed:	case 0x03ee:	case 0x03ef:
				case 0x03f8:	case 0x03f9:	case 0x03fa:	case 0x03fb:
				case 0x03fc:	case 0x03fd:	case 0x03fe:	case 0x03ff:
					// Ignore serial port accesses.
				break;
			}
			return 0xff;
		}